

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::dx
          (value_type *__return_storage_ptr__,FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_> *this
          ,int i)

{
  Fad<Fad<double>_> *pFVar1;
  Fad<double> *pFVar2;
  
  pFVar1 = this->left_;
  pFVar2 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pFVar2 = (pFVar1->dx_).ptr_to_data + i;
  }
  Fad<double>::Fad(__return_storage_ptr__,pFVar2);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i);}